

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void __thiscall
wallet::OutputGroup::Insert
          (OutputGroup *this,shared_ptr<wallet::COutput> *output,size_t ancestors,size_t descendants
          )

{
  long lVar1;
  element_type *peVar2;
  CAmount CVar3;
  int *piVar4;
  CFeeRate *in_RDX;
  COutput *in_RDI;
  long in_FS_OFFSET;
  element_type *coin;
  __shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb8;
  value_type *in_stack_ffffffffffffffc0;
  unsigned_long *puVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::push_back((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)in_RDI,in_stack_ffffffffffffffc0);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::back((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *)in_stack_ffffffffffffffb8);
  peVar2 = std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  CVar3 = COutput::GetFee(in_RDI);
  (in_RDI->txout).nValue = CVar3 + (in_RDI->txout).nValue;
  if (peVar2->input_bytes < 0) {
    puVar5 = (unsigned_long *)0x0;
  }
  else {
    puVar5 = (unsigned_long *)CFeeRate::GetFee(in_RDX,(uint32_t)((ulong)peVar2 >> 0x20));
  }
  peVar2->long_term_fee = (CAmount)puVar5;
  (in_RDI->txout).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (in_RDI->txout).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect +
       peVar2->long_term_fee;
  CVar3 = COutput::GetEffectiveValue(in_RDI);
  *(CAmount *)&(in_RDI->outpoint).n = CVar3 + *(long *)&(in_RDI->outpoint).n;
  (in_RDI->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
  ._M_engaged = ((in_RDI->fee).super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged & 1U & peVar2->from_me & 1U) != 0;
  *(CAmount *)(in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       (peVar2->txout).nValue +
       *(long *)(in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
  piVar4 = std::min<int>((int *)puVar5,(int *)in_stack_ffffffffffffffb8);
  *(int *)((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = *piVar4;
  *(long *)((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       (long)&in_RDX->nSatoshisPerK +
       *(long *)((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  puVar5 = std::max<unsigned_long>(puVar5,(unsigned_long *)in_stack_ffffffffffffffb8);
  *(unsigned_long *)((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
       = *puVar5;
  peVar2 = std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_stack_ffffffffffffffb8);
  if (0 < peVar2->input_bytes) {
    peVar2 = std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_stack_ffffffffffffffb8);
    *(int *)((long)&(in_RDI->txout).scriptPubKey.super_CScriptBase._union + 0x14) =
         peVar2->input_bytes * 4 +
         *(int *)((long)&(in_RDI->txout).scriptPubKey.super_CScriptBase._union + 0x14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void OutputGroup::Insert(const std::shared_ptr<COutput>& output, size_t ancestors, size_t descendants) {
    m_outputs.push_back(output);
    auto& coin = *m_outputs.back();

    fee += coin.GetFee();

    coin.long_term_fee = coin.input_bytes < 0 ? 0 : m_long_term_feerate.GetFee(coin.input_bytes);
    long_term_fee += coin.long_term_fee;

    effective_value += coin.GetEffectiveValue();

    m_from_me &= coin.from_me;
    m_value += coin.txout.nValue;
    m_depth = std::min(m_depth, coin.depth);
    // ancestors here express the number of ancestors the new coin will end up having, which is
    // the sum, rather than the max; this will overestimate in the cases where multiple inputs
    // have common ancestors
    m_ancestors += ancestors;
    // descendants is the count as seen from the top ancestor, not the descendants as seen from the
    // coin itself; thus, this value is counted as the max, not the sum
    m_descendants = std::max(m_descendants, descendants);

    if (output->input_bytes > 0) {
        m_weight += output->input_bytes * WITNESS_SCALE_FACTOR;
    }
}